

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::DrawYAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  float extraout_XMM0_Da;
  int theY_1;
  int theX;
  int theW;
  string theLabel;
  undefined1 local_a8 [8];
  PRect theTickRect;
  string theFormatString;
  bool theIsMajorTick;
  float theY;
  int theY2;
  float theX2;
  int theY1;
  float theTargetX;
  PRect theRect;
  float theX1;
  Painter *inPainter_local;
  PRect *inRect_local;
  PPlot *this_local;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mStyle);
  _theY1 = inRect->mX;
  lVar1 = inRect->mY;
  lVar7 = inRect->mH;
  theX2 = 0.0;
  if (((this->mYAxisSetup).mCrossOrigin & 1U) == 0) {
    if (((this->mXAxisSetup).mAscending & 1U) == 0) {
      theX2 = (this->mXAxisSetup).mMax;
    }
    else {
      theX2 = (this->mXAxisSetup).mMin;
    }
  }
  (*this->mXTrafo->_vptr_Trafo[2])(theX2);
  iVar4 = (int)inRect->mY;
  iVar2 = (int)lVar7;
  (**inPainter->_vptr_Painter)
            (extraout_XMM0_Da,(float)iVar4,extraout_XMM0_Da,(float)(iVar4 + iVar2));
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mTickInfo.mStyle);
  uVar3 = (*this->mYTickIterator->_vptr_TickIterator[2])();
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)&theTickRect.mH);
    PRect::PRect((PRect *)local_a8);
    if (((this->mYAxisSetup).mTickInfo.mTicksOn & 1U) != 0) {
      while (uVar3 = (*this->mYTickIterator->_vptr_TickIterator[3])
                               (this->mYTickIterator,
                                (undefined1 *)((long)&theFormatString.field_2 + 0xc),
                                (undefined1 *)((long)&theFormatString.field_2 + 0xb),&theTickRect.mH
                               ), (uVar3 & 1) != 0) {
        uVar3 = (*(this->super_PDrawer)._vptr_PDrawer[0xd])
                          (theFormatString.field_2._12_4_,this,(ulong)(uint)(int)extraout_XMM0_Da,
                           (ulong)((byte)theFormatString.field_2._M_local_buf[0xb] & 1),
                           &theTickRect.mH,inPainter,local_a8);
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = false;
          theLabel.field_2._8_4_ = 1;
          goto LAB_00109377;
        }
        if ((long)local_a8 < (long)_theY1) {
          _theY1 = (ulong)local_a8;
        }
      }
    }
    (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mStyle);
    std::__cxx11::string::string((string *)&theX,(string *)&(this->mYAxisSetup).mLabel);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      uVar6 = std::__cxx11::string::c_str();
      iVar4 = (*inPainter->_vptr_Painter[8])(inPainter,uVar6);
      theRect.mX._0_4_ = (int)lVar1;
      lVar7 = lVar7 - iVar4;
      uVar6 = std::__cxx11::string::c_str();
      (*inPainter->_vptr_Painter[0xb])
                (0xc2b40000,inPainter,_theY1 & 0xffffffff,
                 (ulong)(uint)(((int)theRect.mX + iVar2) -
                              (int)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1)),uVar6);
    }
    this_local._7_1_ = true;
    theLabel.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&theX);
LAB_00109377:
    std::__cxx11::string::~string((string *)&theTickRect.mH);
  }
  return this_local._7_1_;
}

Assistant:

bool PPlot::DrawYAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mYAxisSetup.mStyle);
      float theX1;
      PRect theRect = inRect;
      float theTargetX = 0;
      if (!mYAxisSetup.mCrossOrigin) {
        if (mXAxisSetup.mAscending) {
          theTargetX = mXAxisSetup.mMin;
        }
        else {
          theTargetX = mXAxisSetup.mMax;
        }
      }
      theX1 = mXTrafo->Transform (theTargetX);

      int theY1 = inRect.mY;
      float theX2 = theX1;
      int theY2 = theY1+theRect.mH;

      // draw y axis
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mYAxisSetup.mTickInfo.mStyle);
      if (!mYTickIterator->Init ()) {
        return false;
      }

      float theY;
      bool theIsMajorTick;
      string theFormatString;
      PRect theTickRect;

      if (mYAxisSetup.mTickInfo.mTicksOn) {
          while (mYTickIterator->GetNextTick (theY, theIsMajorTick, theFormatString)) {
              if (!DrawYTick (theY, theX1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }

              if (theTickRect.mX < theRect.mX) {
                  theRect.mX = theTickRect.mX;
              }
          }
      }
      
      // draw label
      inPainter.SetStyle (mYAxisSetup.mStyle);
      string theLabel = mYAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX;
        int theY = theRect.mY + theRect.mH - (theRect.mH-theW)/2;
        inPainter.DrawRotatedText (theX, theY, -90, theLabel.c_str ());
      }

      return true;
    }